

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaAnnotPtr xmlSchemaParseAnnotation(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int needed)

{
  bool bVar1;
  int iVar2;
  xmlSchemaTypePtr pxVar3;
  xmlAttrPtr attr_00;
  xmlAttrPtr pxStack_40;
  int barked;
  xmlAttrPtr attr;
  xmlNodePtr child;
  xmlSchemaAnnotPtr ret;
  int needed_local;
  xmlNodePtr node_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  bVar1 = false;
  if ((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (node == (xmlNodePtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    if (needed == 0) {
      child = (xmlNodePtr)0x0;
    }
    else {
      child = (xmlNodePtr)xmlSchemaNewAnnot(ctxt,node);
    }
    for (pxStack_40 = node->properties; pxStack_40 != (xmlAttrPtr)0x0; pxStack_40 = pxStack_40->next
        ) {
      if (((pxStack_40->ns == (xmlNs *)0x0) &&
          (iVar2 = xmlStrEqual(pxStack_40->name,"id"), iVar2 == 0)) ||
         ((pxStack_40->ns != (xmlNs *)0x0 &&
          (iVar2 = xmlStrEqual(pxStack_40->ns->href,xmlSchemaNs), iVar2 != 0)))) {
        xmlSchemaPIllegalAttrErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,pxStack_40);
      }
    }
    xmlSchemaPValAttrID(ctxt,node,"id");
    attr = (xmlAttrPtr)node->children;
    while (attr != (xmlAttrPtr)0x0) {
      if ((((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
          (iVar2 = xmlStrEqual(attr->name,(xmlChar *)"appinfo"), iVar2 == 0)) ||
         (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 == 0)) {
        if (((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
           ((iVar2 = xmlStrEqual(attr->name,(xmlChar *)"documentation"), iVar2 == 0 ||
            (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 == 0)))) {
          if (!bVar1) {
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,node,
                       (xmlNodePtr)attr,(char *)0x0,"(appinfo | documentation)*");
          }
          bVar1 = true;
          attr = attr->next;
        }
        else {
          for (pxStack_40 = (xmlAttrPtr)attr->psvi; pxStack_40 != (xmlAttrPtr)0x0;
              pxStack_40 = pxStack_40->next) {
            if (pxStack_40->ns == (xmlNs *)0x0) {
              iVar2 = xmlStrEqual(pxStack_40->name,"source");
              if (iVar2 == 0) {
                xmlSchemaPIllegalAttrErr
                          (ctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,
                           pxStack_40);
              }
            }
            else {
              iVar2 = xmlStrEqual(pxStack_40->ns->href,xmlSchemaNs);
              if ((iVar2 != 0) ||
                 ((iVar2 = xmlStrEqual(pxStack_40->name,"lang"), iVar2 != 0 &&
                  (iVar2 = xmlStrEqual(pxStack_40->ns->href,
                                       (xmlChar *)"http://www.w3.org/XML/1998/namespace"),
                  iVar2 == 0)))) {
                xmlSchemaPIllegalAttrErr
                          (ctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,
                           pxStack_40);
              }
            }
          }
          attr_00 = xmlSchemaGetPropNodeNs
                              ((xmlNodePtr)attr,"http://www.w3.org/XML/1998/namespace","lang");
          if (attr_00 != (xmlAttrPtr)0x0) {
            pxVar3 = xmlSchemaGetBuiltInType(XML_SCHEMAS_LANGUAGE);
            xmlSchemaPValAttrNode(ctxt,(xmlSchemaBasicItemPtr)0x0,attr_00,pxVar3,(xmlChar **)0x0);
          }
          attr = attr->next;
        }
      }
      else {
        for (pxStack_40 = (xmlAttrPtr)attr->psvi; pxStack_40 != (xmlAttrPtr)0x0;
            pxStack_40 = pxStack_40->next) {
          if (((pxStack_40->ns == (xmlNs *)0x0) &&
              (iVar2 = xmlStrEqual(pxStack_40->name,"source"), iVar2 == 0)) ||
             ((pxStack_40->ns != (xmlNs *)0x0 &&
              (iVar2 = xmlStrEqual(pxStack_40->ns->href,xmlSchemaNs), iVar2 != 0)))) {
            xmlSchemaPIllegalAttrErr
                      (ctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,pxStack_40);
          }
        }
        pxVar3 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
        xmlSchemaPValAttr(ctxt,(xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)attr,"source",pxVar3,
                          (xmlChar **)0x0);
        attr = attr->next;
      }
    }
    ctxt_local = (xmlSchemaParserCtxtPtr)child;
  }
  return (xmlSchemaAnnotPtr)ctxt_local;
}

Assistant:

static xmlSchemaAnnotPtr
xmlSchemaParseAnnotation(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node, int needed)
{
    xmlSchemaAnnotPtr ret;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    int barked = 0;

    /*
    * INFO: S4S completed.
    */
    /*
    * id = ID
    * {any attributes with non-schema namespace . . .}>
    * Content: (appinfo | documentation)*
    */
    if ((ctxt == NULL) || (node == NULL))
        return (NULL);
    if (needed)
	ret = xmlSchemaNewAnnot(ctxt, node);
    else
	ret = NULL;
    attr = node->properties;
    while (attr != NULL) {
	if (((attr->ns == NULL) &&
	    (!xmlStrEqual(attr->name, BAD_CAST "id"))) ||
	    ((attr->ns != NULL) &&
	    xmlStrEqual(attr->ns->href, xmlSchemaNs))) {

	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    while (child != NULL) {
	if (IS_SCHEMA(child, "appinfo")) {
	    /* TODO: make available the content of "appinfo". */
	    /*
	    * source = anyURI
	    * {any attributes with non-schema namespace . . .}>
	    * Content: ({any})*
	    */
	    attr = child->properties;
	    while (attr != NULL) {
		if (((attr->ns == NULL) &&
		     (!xmlStrEqual(attr->name, BAD_CAST "source"))) ||
		     ((attr->ns != NULL) &&
		      xmlStrEqual(attr->ns->href, xmlSchemaNs))) {

		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
		attr = attr->next;
	    }
	    xmlSchemaPValAttr(ctxt, NULL, child, "source",
		xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI), NULL);
	    child = child->next;
	} else if (IS_SCHEMA(child, "documentation")) {
	    /* TODO: make available the content of "documentation". */
	    /*
	    * source = anyURI
	    * {any attributes with non-schema namespace . . .}>
	    * Content: ({any})*
	    */
	    attr = child->properties;
	    while (attr != NULL) {
		if (attr->ns == NULL) {
		    if (!xmlStrEqual(attr->name, BAD_CAST "source")) {
			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		} else {
		    if (xmlStrEqual(attr->ns->href, xmlSchemaNs) ||
			(xmlStrEqual(attr->name, BAD_CAST "lang") &&
			(!xmlStrEqual(attr->ns->href, XML_XML_NAMESPACE)))) {

			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		}
		attr = attr->next;
	    }
	    /*
	    * Attribute "xml:lang".
	    */
	    attr = xmlSchemaGetPropNodeNs(child, (const char *) XML_XML_NAMESPACE, "lang");
	    if (attr != NULL)
		xmlSchemaPValAttrNode(ctxt, NULL, attr,
		xmlSchemaGetBuiltInType(XML_SCHEMAS_LANGUAGE), NULL);
	    child = child->next;
	} else {
	    if (!barked)
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		    NULL, node, child, NULL, "(appinfo | documentation)*");
	    barked = 1;
	    child = child->next;
	}
    }

    return (ret);
}